

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 SyBlobFormatAp(SyBlob *pBlob,char *zFormat,__va_list_tag *ap)

{
  sxu32 local_24;
  __va_list_tag *p_Stack_20;
  sxu32 n;
  __va_list_tag *ap_local;
  char *zFormat_local;
  SyBlob *pBlob_local;
  
  local_24 = 0;
  p_Stack_20 = ap;
  ap_local = (__va_list_tag *)zFormat;
  zFormat_local = (char *)pBlob;
  FormatMount(6,pBlob,(ProcConsumer)0x0,(void *)0x0,&local_24,zFormat,ap);
  return local_24;
}

Assistant:

JX9_PRIVATE sxu32 SyBlobFormatAp(SyBlob *pBlob, const char *zFormat, va_list ap)
{
	sxu32 n = 0; /* cc warning */
#if defined(UNTRUST)	
	if( SX_EMPTY_STR(zFormat) ){
		return 0;
	}
#endif	
	FormatMount(SXFMT_CONS_BLOB, &(*pBlob), 0, 0, &n, zFormat, ap);
	return n;
}